

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setFlag(QGraphicsItem *this,GraphicsItemFlag flag,bool enabled)

{
  QGraphicsItemPrivate *pQVar1;
  byte in_DL;
  QFlags<QGraphicsItem::GraphicsItemFlag> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *in_stack_00000108;
  GraphicsItemFlags in_stack_0000014c;
  undefined4 in_stack_ffffffffffffffd0;
  QFlag in_stack_ffffffffffffffd4;
  QFlag local_18 [2];
  QFlag local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DL & 1) == 0) {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 2));
    QFlag::QFlag(local_18,(uint)((ulong)*(undefined8 *)&pQVar1->field_0x160 >> 0x20) & 0xfffff);
    QFlags<QGraphicsItem::GraphicsItemFlag>::QFlagsStorageHelper(in_RDI,in_stack_ffffffffffffffd4);
    QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
              ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
               CONCAT44(in_stack_ffffffffffffffd4.i,in_stack_ffffffffffffffd0),
               (int)((ulong)in_RDI >> 0x20));
    setFlags(in_stack_00000108,in_stack_0000014c);
  }
  else {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 2));
    QFlag::QFlag(local_10,(uint)((ulong)*(undefined8 *)&pQVar1->field_0x160 >> 0x20) & 0xfffff);
    QFlags<QGraphicsItem::GraphicsItemFlag>::QFlagsStorageHelper(in_RDI,in_stack_ffffffffffffffd4);
    QFlags<QGraphicsItem::GraphicsItemFlag>::operator|
              ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
               CONCAT44(in_stack_ffffffffffffffd4.i,in_stack_ffffffffffffffd0),
               (GraphicsItemFlag)((ulong)in_RDI >> 0x20));
    setFlags(in_stack_00000108,in_stack_0000014c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setFlag(GraphicsItemFlag flag, bool enabled)
{
    if (enabled)
        setFlags(GraphicsItemFlags(d_ptr->flags) | flag);
    else
        setFlags(GraphicsItemFlags(d_ptr->flags) & ~flag);
}